

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zet_libapi.cpp
# Opt level: O0

ze_result_t zetDebugAcknowledgeEvent(zet_debug_session_handle_t hDebug,zet_debug_event_t *event)

{
  zet_pfnDebugAcknowledgeEvent_t p_Var1;
  __pointer_type p_Var2;
  zet_pfnDebugAcknowledgeEvent_t pfnAcknowledgeEvent;
  zet_debug_event_t *event_local;
  zet_debug_session_handle_t hDebug_local;
  
  if ((ze_lib::destruction & 1) == 0) {
    p_Var2 = std::atomic<_zet_dditable_t_*>::load
                       ((atomic<_zet_dditable_t_*> *)(ze_lib::context + 0x18),memory_order_seq_cst);
    p_Var1 = (p_Var2->Debug).pfnAcknowledgeEvent;
    if (p_Var1 == (zet_pfnDebugAcknowledgeEvent_t)0x0) {
      if ((*(byte *)(ze_lib::context + 0xd90) & 1) == 0) {
        hDebug_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
      }
      else {
        hDebug_local._4_4_ = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
      }
    }
    else {
      hDebug_local._4_4_ = (*p_Var1)(hDebug,event);
    }
  }
  else {
    hDebug_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  return hDebug_local._4_4_;
}

Assistant:

ze_result_t ZE_APICALL
zetDebugAcknowledgeEvent(
    zet_debug_session_handle_t hDebug,              ///< [in] debug session handle
    const zet_debug_event_t* event                  ///< [in] a pointer to a ::zet_debug_event_t.
    )
{
    #ifdef DYNAMIC_LOAD_LOADER
    ze_result_t result = ZE_RESULT_SUCCESS;
    if(ze_lib::destruction) {
        return ZE_RESULT_ERROR_UNINITIALIZED;
    }
    static const zet_pfnDebugAcknowledgeEvent_t pfnAcknowledgeEvent = [&result] {
        auto pfnAcknowledgeEvent = ze_lib::context->zetDdiTable.load()->Debug.pfnAcknowledgeEvent;
        if( nullptr == pfnAcknowledgeEvent ) {
            result = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
        }
        return pfnAcknowledgeEvent;
    }();
    if (result != ZE_RESULT_SUCCESS) {
        return result;
    }
    return pfnAcknowledgeEvent( hDebug, event );
    #else
    if(ze_lib::destruction) {
        return ZE_RESULT_ERROR_UNINITIALIZED;
    }

    auto pfnAcknowledgeEvent = ze_lib::context->zetDdiTable.load()->Debug.pfnAcknowledgeEvent;
    if( nullptr == pfnAcknowledgeEvent ) {
        if(!ze_lib::context->isInitialized)
            return ZE_RESULT_ERROR_UNINITIALIZED;
        else
            return ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
    }

    return pfnAcknowledgeEvent( hDebug, event );
    #endif
}